

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

uint8 * __thiscall
sentencepiece::SelfTestData::_InternalSerialize
          (SelfTestData *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  uint32 uVar2;
  int size;
  uint8 *puVar3;
  SelfTestData_Sample *this_00;
  InternalMetadata *pIVar4;
  void *data;
  uint local_c8;
  uint n;
  uint i;
  uint32 cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8 *target_local;
  SelfTestData *this_local;
  
  local_c8 = 0;
  uVar1 = _internal_samples_size(this);
  stream_local = (EpsCopyOutputStream *)target;
  for (; local_c8 < uVar1; local_c8 = local_c8 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 *)stream_local);
    this_00 = _internal_samples(this,local_c8);
    uVar2 = google::protobuf::internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    uVar2 = SelfTestData_Sample::GetCachedSize(this_00);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    stream_local = (EpsCopyOutputStream *)
                   SelfTestData_Sample::_InternalSerialize(this_00,puVar3,stream);
  }
  stream_local = (EpsCopyOutputStream *)
                 google::protobuf::internal::ExtensionSet::_InternalSerialize
                           (&this->_extensions_,200,0x20000000,(uint8 *)stream_local,stream);
  if (((uint)(this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 1) {
    pIVar4 = &(this->super_MessageLite)._internal_metadata_;
    if (((uint)pIVar4->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (pIVar4);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    data = (void *)std::__cxx11::string::data();
    pIVar4 = &(this->super_MessageLite)._internal_metadata_;
    if (((uint)pIVar4->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (pIVar4);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    size = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,size,(uint8 *)stream_local);
  }
  return (uint8 *)stream_local;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* SelfTestData::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.SelfTestData)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .sentencepiece.SelfTestData.Sample samples = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_samples_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_samples(i), target, stream);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.SelfTestData)
  return target;
}